

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::OfHelper
              (bool isTypedArrayEntryPoint,Arguments *args,ScriptContext *scriptContext)

{
  code *pcVar1;
  anon_class_32_4_7a04c08f_for_newObjectCreationFunction newObjectCreationFunction;
  bool bVar2;
  bool bVar3;
  uint32 length;
  BOOL succeeded;
  ThreadContext *pTVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptFunction *constructor_00;
  JavascriptFunction *pJVar7;
  JavascriptLibrary *pJVar8;
  RecyclableObject *pDestObj;
  bool local_112;
  Var kValue_2;
  uint32 k_2;
  Var kValue_1;
  uint32 k_1;
  Var kValue;
  uint32 k;
  undefined4 uStack_94;
  undefined7 uStack_87;
  bool isBuiltInTypedArrayCtor;
  RecyclableObject *constructor;
  TypedArrayBase *pTStack_68;
  bool isBuiltinArrayCtor;
  TypedArrayBase *newTypedArray;
  JavascriptArray *newArr;
  Var newObj;
  uint32 len;
  undefined1 local_40 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Arguments *args_local;
  bool isTypedArrayEntryPoint_local;
  
  jsReentLock._24_8_ = scriptContext;
  pTVar4 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_40,pTVar4);
  if (((ulong)args->Info & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x298a,"(args.Info.Count > 0)","args.Info.Count > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  length = (*(uint *)&args->Info & 0xffffff) - 1;
  pTStack_68 = (TypedArrayBase *)0x0;
  bVar2 = true;
  pvVar6 = Arguments::operator[](args,0);
  bVar3 = Js::JavascriptOperators::IsConstructor(pvVar6);
  if (bVar3) {
    pvVar6 = Arguments::operator[](args,0);
    constructor_00 = (JavascriptFunction *)VarTo<Js::RecyclableObject>(pvVar6);
    pJVar8 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
    pJVar7 = JavascriptLibraryBase::GetArrayConstructor(&pJVar8->super_JavascriptLibraryBase);
    bVar2 = constructor_00 == pJVar7;
    bVar3 = JavascriptLibrary::IsTypedArrayConstructor
                      (constructor_00,(ScriptContext *)jsReentLock._24_8_);
    JsReentLock::unlock((JsReentLock *)local_40);
    local_112 = true;
    if (!bVar2) {
      local_112 = bVar3;
    }
    pTVar4 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
    newObjectCreationFunction._12_4_ = uStack_94;
    newObjectCreationFunction.len = length;
    newObjectCreationFunction._25_7_ = uStack_87;
    newObjectCreationFunction.isTypedArrayEntryPoint = isTypedArrayEntryPoint;
    newObjectCreationFunction.constructor = (RecyclableObject *)constructor_00;
    newObjectCreationFunction.scriptContext = (ScriptContext *)jsReentLock._24_8_;
    newArr = (JavascriptArray *)
             Js::JavascriptOperators::
             NewObjectCreationHelper_ReentrancySafe<Js::JavascriptArray::OfHelper(bool,Js::Arguments&,Js::ScriptContext*)::__0>
                       ((RecyclableObject *)constructor_00,local_112,pTVar4,
                        newObjectCreationFunction);
    JsReentLock::MutateArrayObject((JsReentLock *)local_40);
    JsReentLock::relock((JsReentLock *)local_40);
    newTypedArray = (TypedArrayBase *)TryVarToNonES5Array(newArr);
    if (newTypedArray == (TypedArrayBase *)0x0) {
      bVar3 = VarIs<Js::TypedArrayBase>(newArr);
      if (bVar3) {
        pTStack_68 = UnsafeVarTo<Js::TypedArrayBase>(newArr);
      }
    }
    else {
      JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(newTypedArray);
      JsReentLock::setObjectForMutation((JsReentLock *)local_40,newTypedArray);
    }
  }
  else {
    if (isTypedArrayEntryPoint) {
      JavascriptError::ThrowTypeError
                ((ScriptContext *)jsReentLock._24_8_,-0x7ff5ec40,L"[TypedArray].of");
    }
    pJVar8 = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
    newTypedArray = (TypedArrayBase *)JavascriptLibrary::CreateArray(pJVar8,length);
    EnsureHead<void*>((JavascriptArray *)newTypedArray);
    newArr = (JavascriptArray *)newTypedArray;
  }
  if (newArr == (JavascriptArray *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x29c8,"(newObj)","newObj");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (bVar2) {
    for (kValue._4_4_ = 0; kValue._4_4_ < length; kValue._4_4_ = kValue._4_4_ + 1) {
      pvVar6 = Arguments::operator[](args,kValue._4_4_ + 1);
      DirectSetItemAt<void*>((JavascriptArray *)newTypedArray,kValue._4_4_,pvVar6);
    }
  }
  else if (pTStack_68 == (TypedArrayBase *)0x0) {
    for (kValue_2._4_4_ = 0; kValue_2._4_4_ < length; kValue_2._4_4_ = kValue_2._4_4_ + 1) {
      pvVar6 = Arguments::operator[](args,kValue_2._4_4_ + 1);
      JsReentLock::unlock((JsReentLock *)local_40);
      pDestObj = VarTo<Js::RecyclableObject>(newArr);
      succeeded = SetArrayLikeObjects(pDestObj,kValue_2._4_4_,pvVar6);
      ThrowErrorOnFailure(succeeded,(ScriptContext *)jsReentLock._24_8_,kValue_2._4_4_);
      JsReentLock::MutateArrayObject((JsReentLock *)local_40);
      JsReentLock::relock((JsReentLock *)local_40);
    }
  }
  else {
    for (kValue_1._4_4_ = 0; kValue_1._4_4_ < length; kValue_1._4_4_ = kValue_1._4_4_ + 1) {
      pvVar6 = Arguments::operator[](args,kValue_1._4_4_ + 1);
      JsReentLock::unlock((JsReentLock *)local_40);
      (*(pTStack_68->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
        super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x70])(pTStack_68,(ulong)kValue_1._4_4_,pvVar6);
      JsReentLock::MutateArrayObject((JsReentLock *)local_40);
      JsReentLock::relock((JsReentLock *)local_40);
    }
  }
  if (!isTypedArrayEntryPoint) {
    JsReentLock::unlock((JsReentLock *)local_40);
    pvVar6 = JavascriptNumber::ToVar(length,(ScriptContext *)jsReentLock._24_8_);
    Js::JavascriptOperators::OP_SetProperty
              (newArr,0xd1,pvVar6,(ScriptContext *)jsReentLock._24_8_,(PropertyValueInfo *)0x0,
               PropertyOperation_ThrowIfNotExtensible,(Var)0x0);
    JsReentLock::MutateArrayObject((JsReentLock *)local_40);
    JsReentLock::relock((JsReentLock *)local_40);
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_40);
  return newArr;
}

Assistant:

Var JavascriptArray::OfHelper(bool isTypedArrayEntryPoint, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(args.Info.Count > 0);

        // args.Info.Count cannot equal zero or we would have thrown above so no chance of underflowing
        uint32 len = args.Info.Count - 1;
        Var newObj = nullptr;
        JavascriptArray* newArr = nullptr;
        TypedArrayBase* newTypedArray = nullptr;
        bool isBuiltinArrayCtor = true;

        if (JavascriptOperators::IsConstructor(args[0]))
        {
            RecyclableObject* constructor = VarTo<RecyclableObject>(args[0]);
            isBuiltinArrayCtor = (constructor == scriptContext->GetLibrary()->GetArrayConstructor());
            bool isBuiltInTypedArrayCtor = JavascriptLibrary::IsTypedArrayConstructor(constructor, scriptContext);

            JS_REENTRANT
            (
                jsReentLock,
                newObj = JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isBuiltinArrayCtor || isBuiltInTypedArrayCtor, scriptContext->GetThreadContext(), [=]()->Js::Var
                {
                    Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(len, scriptContext) };
                    Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                    if (isTypedArrayEntryPoint)
                    {
                        return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), len, scriptContext);
                    }
                    else
                    {
                        return JavascriptOperators::NewScObject(constructor, Js::Arguments(constructorCallInfo, constructorArgs), scriptContext);
                    }
                });
            )

            // If the new object we created is an array, remember that as it will save us time setting properties in the object below
            newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            if (newArr)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
                SETOBJECT_FOR_MUTATION(jsReentLock, newArr);

            }
            else if (VarIs<TypedArrayBase>(newObj))
            {
                newTypedArray = UnsafeVarTo<TypedArrayBase>(newObj);
            }
        }
        else
        {
            // We only throw when the constructor property is not a constructor function in the TypedArray version
            if (isTypedArrayEntryPoint)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedFunction, _u("[TypedArray].of"));
            }

            newArr = scriptContext->GetLibrary()->CreateArray(len);
            newArr->EnsureHead<Var>();
            newObj = newArr;
        }

        // At least we have a new object of some kind
        Assert(newObj);

        if (isBuiltinArrayCtor)
        {
            for (uint32 k = 0; k < len; k++)
            {
                Var kValue = args[k + 1];

                newArr->DirectSetItemAt(k, kValue);
            }
        }
        else if (newTypedArray)
        {
            for (uint32 k = 0; k < len; k++)
            {
                Var kValue = args[k + 1];

                JS_REENTRANT(jsReentLock, newTypedArray->DirectSetItem(k, kValue));
            }
        }
        else
        {
            for (uint32 k = 0; k < len; k++)
            {
                Var kValue = args[k + 1];
                JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(VarTo<RecyclableObject>(newObj), k, kValue), scriptContext, k));
            }
        }

        if (!isTypedArrayEntryPoint)
        {
            // Set length if we are in the Array version of the function
            JS_REENTRANT(jsReentLock, JavascriptOperators::OP_SetProperty(newObj, Js::PropertyIds::length, JavascriptNumber::ToVar(len, scriptContext), scriptContext, nullptr, PropertyOperation_ThrowIfNotExtensible));
        }

        return newObj;
    }